

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O0

_Bool os_system_linux_is_minimal_kernel(int v1,int v2,int v3)

{
  oonf_log_source oVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  int third;
  int second;
  int first;
  char *next;
  utsname uts;
  int v3_local;
  int v2_local;
  int v1_local;
  
  uts.__domainname._57_4_ = v3;
  uts.__domainname._61_4_ = v2;
  memset((void *)((long)&next + 2),0,0x186);
  iVar2 = uname((utsname *)((long)&next + 2));
  oVar1 = _oonf_os_system_subsystem.logging;
  if (iVar2 == 0) {
    lVar5 = strtol(uts.nodename + 0x39,(char **)&second,10);
    if (v1 < (int)lVar5) {
      v2_local._3_1_ = true;
    }
    else if ((int)lVar5 < v1) {
      v2_local._3_1_ = false;
    }
    else {
      if (*_second == '.') {
        lVar5 = strtol(_second + 1,(char **)&second,10);
        if ((int)uts.__domainname._61_4_ < (int)lVar5) {
          return true;
        }
        if ((int)lVar5 < (int)uts.__domainname._61_4_) {
          return false;
        }
        if (*_second == '.') {
          lVar5 = strtol(_second + 1,(char **)0x0,10);
          return (int)uts.__domainname._57_4_ <= (int)lVar5;
        }
      }
      if (((&log_global_mask)[_oonf_os_system_subsystem.logging] & 4) != 0) {
        oonf_log(4,_oonf_os_system_subsystem.logging,"src/base/os_linux/os_system_linux.c",0xe0,0,0,
                 "Error, cannot parse kernel version: %s\n",uts.nodename + 0x39);
      }
      v2_local._3_1_ = false;
    }
  }
  else {
    if (((&log_global_mask)[_oonf_os_system_subsystem.logging] & 4) != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      piVar3 = __errno_location();
      oonf_log(4,oVar1,"src/base/os_linux/os_system_linux.c",0xc0,0,0,
               "Error, could not read kernel version: %s (%d)\n",pcVar4,*piVar3);
    }
    v2_local._3_1_ = false;
  }
  return v2_local._3_1_;
}

Assistant:

bool
os_system_linux_is_minimal_kernel(int v1, int v2, int v3) {
  struct utsname uts;
  char *next;
  int first = 0, second = 0, third = 0;

  memset(&uts, 0, sizeof(uts));
  if (uname(&uts)) {
    OONF_WARN(LOG_OS_SYSTEM, "Error, could not read kernel version: %s (%d)\n", strerror(errno), errno);
    return false;
  }

  first = strtol(uts.release, &next, 10);
  /* check for linux 3.x */
  if (first > v1) {
    return true;
  }
  else if (first < v1) {
    return false;
  }

  if (*next != '.') {
    goto kernel_parse_error;
  }

  second = strtol(next + 1, &next, 10);
  if (second > v2) {
    return true;
  }
  if (second < v2) {
    return false;
  }
  if (*next != '.') {
    goto kernel_parse_error;
  }

  third = strtol(next + 1, NULL, 10);
  return third >= v3;

kernel_parse_error:
  OONF_WARN(LOG_OS_SYSTEM, "Error, cannot parse kernel version: %s\n", uts.release);
  return false;
}